

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::BP5Writer::WriteMetadataFileIndex
          (BP5Writer *this,uint64_t MetaDataPos,uint64_t MetaDataSize)

{
  Comm *this_00;
  undefined8 *puVar1;
  pointer pvVar2;
  pointer puVar3;
  undefined8 uVar4;
  int iVar5;
  long lVar6;
  pointer pvVar7;
  ulong uVar8;
  int writer;
  long lVar9;
  char *src;
  size_type __n;
  size_t sVar10;
  vector<char,_std::allocator<char>_> buf;
  size_t local_80;
  vector<char,_std::allocator<char>_> local_78;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_60;
  uint64_t local_58;
  string local_50;
  
  pvVar7 = (this->FlushPosSizeInfo).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = (this->FlushPosSizeInfo).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = &(this->super_Engine).m_Comm;
  iVar5 = helper::Comm::Size(this_00);
  lVar9 = (ulong)(MetaDataPos == 0) * 0x40 +
          (long)iVar5 * (((ulong)((long)pvVar7 - (long)pvVar2) >> 3) * 0x5555555555555556 + 1) * 8;
  __n = lVar9 + 0x21;
  local_58 = MetaDataSize;
  if ((this->m_WriterSubfileMap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->m_WriterSubfileMap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    iVar5 = helper::Comm::Size(this_00);
    __n = lVar9 + 0x42 + (long)iVar5 * 8;
  }
  std::vector<char,_std::allocator<char>_>::vector(&local_78,__n,(allocator_type *)&local_80);
  local_80 = 0;
  if (MetaDataPos == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Index Table","");
    MakeHeader(this,&local_78,&local_80,&local_50,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  sVar10 = local_80;
  if ((this->m_WriterSubfileMap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->m_WriterSubfileMap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[local_80] = 'w';
    local_80 = local_80 + 1;
    iVar5 = helper::Comm::Size(this_00);
    *(long *)(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + sVar10 + 1) = (long)iVar5 * 8 + 0x18;
    local_80 = sVar10 + 9;
    iVar5 = helper::Comm::Size(this_00);
    *(long *)(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + sVar10 + 9) = (long)iVar5;
    *(size_t *)
     (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start + sVar10 + 0x11) = this->m_Aggregator->m_NumAggregators;
    *(size_t *)
     (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start + sVar10 + 0x19) = this->m_Aggregator->m_SubStreams;
    sVar10 = sVar10 + 0x21;
    puVar3 = (this->m_WriterSubfileMap).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_80 = sVar10;
    iVar5 = helper::Comm::Size(this_00);
    if (iVar5 != 0) {
      memmove(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + sVar10,puVar3,(long)iVar5 * 8);
    }
    local_80 = (long)iVar5 * 8 + sVar10;
    puVar3 = (this->m_WriterSubfileMap).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_WriterSubfileMap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish != puVar3) {
      (this->m_WriterSubfileMap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar3;
    }
  }
  sVar10 = local_80;
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [local_80] = 's';
  local_80 = local_80 + 1;
  pvVar7 = (this->FlushPosSizeInfo).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->FlushPosSizeInfo).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar5 = helper::Comm::Size(this_00);
  local_60 = &this->FlushPosSizeInfo;
  *(ulong *)(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + sVar10 + 1) =
       (long)iVar5 * (((ulong)((long)pvVar2 - (long)pvVar7) >> 3) * 0x5555555555555556 + 1) * 8 +
       0x18;
  *(uint64_t *)
   (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start + sVar10 + 9) = MetaDataPos;
  *(uint64_t *)
   (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start + sVar10 + 0x11) = local_58;
  *(long *)(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start + sVar10 + 0x19) =
       ((long)(this->FlushPosSizeInfo).
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->FlushPosSizeInfo).
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  sVar10 = sVar10 + 0x21;
  lVar9 = 0;
  local_80 = sVar10;
  while( true ) {
    iVar5 = helper::Comm::Size(this_00);
    if (iVar5 <= lVar9) break;
    pvVar7 = (this->FlushPosSizeInfo).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->FlushPosSizeInfo).
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pvVar7) {
      lVar6 = 0;
      uVar8 = 0;
      do {
        puVar1 = (undefined8 *)
                 (*(long *)((long)&(pvVar7->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start + lVar6) +
                 lVar9 * 0x10);
        uVar4 = puVar1[1];
        *(undefined8 *)
         (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start + sVar10) = *puVar1;
        *(undefined8 *)
         (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start + sVar10 + 8) = uVar4;
        sVar10 = sVar10 + 0x10;
        uVar8 = uVar8 + 1;
        pvVar7 = (this->FlushPosSizeInfo).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x18;
      } while (uVar8 < (ulong)(((long)(this->FlushPosSizeInfo).
                                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3
                               ) * -0x5555555555555555));
    }
    *(unsigned_long *)
     (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start + sVar10) =
         (this->m_WriterDataPos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_start[lVar9];
    sVar10 = sVar10 + 8;
    lVar9 = lVar9 + 1;
  }
  local_80 = sVar10;
  transportman::TransportMan::WriteFiles
            (&this->m_FileMetadataIndexManager,
             local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,-1);
  transportman::TransportMan::FlushFiles(&this->m_FileMetadataIndexManager,-1);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(local_60);
  if (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BP5Writer::WriteMetadataFileIndex(uint64_t MetaDataPos, uint64_t MetaDataSize)
{
    // bufsize: Step record
    size_t bufsize =
        1 + (4 + ((FlushPosSizeInfo.size() * 2) + 1) * m_Comm.Size()) * sizeof(uint64_t);
    if (MetaDataPos == 0)
    {
        //  First time, write the headers
        bufsize += m_IndexHeaderSize;
    }
    if (!m_WriterSubfileMap.empty())
    {
        // WriterMap record
        bufsize += 1 + (4 + m_Comm.Size()) * sizeof(uint64_t);
    }

    std::vector<char> buf(bufsize);
    size_t pos = 0;
    uint64_t d;
    unsigned char record;

    if (MetaDataPos == 0)
    {
        //  First time, write the headers
        MakeHeader(buf, pos, "Index Table", true);
    }

    // WriterMap record
    if (!m_WriterSubfileMap.empty())
    {
        record = WriterMapRecord;
        helper::CopyToBuffer(buf, pos, &record, 1); // record type
        d = (3 + m_Comm.Size()) * sizeof(uint64_t);
        helper::CopyToBuffer(buf, pos, &d, 1); // record length
        d = static_cast<uint64_t>(m_Comm.Size());
        helper::CopyToBuffer(buf, pos, &d, 1);
        d = static_cast<uint64_t>(m_Aggregator->m_NumAggregators);
        helper::CopyToBuffer(buf, pos, &d, 1);
        d = static_cast<uint64_t>(m_Aggregator->m_SubStreams);
        helper::CopyToBuffer(buf, pos, &d, 1);
        helper::CopyToBuffer(buf, pos, m_WriterSubfileMap.data(), m_Comm.Size());
        m_WriterSubfileMap.clear();
    }

    // Step record
    record = StepRecord;
    helper::CopyToBuffer(buf, pos, &record, 1); // record type
    d = (3 + ((FlushPosSizeInfo.size() * 2) + 1) * m_Comm.Size()) * sizeof(uint64_t);
    helper::CopyToBuffer(buf, pos, &d, 1); // record length
    helper::CopyToBuffer(buf, pos, &MetaDataPos, 1);
    helper::CopyToBuffer(buf, pos, &MetaDataSize, 1);
    d = static_cast<uint64_t>(FlushPosSizeInfo.size());
    helper::CopyToBuffer(buf, pos, &d, 1);

    for (int writer = 0; writer < m_Comm.Size(); writer++)
    {
        for (size_t flushNum = 0; flushNum < FlushPosSizeInfo.size(); flushNum++)
        {
            // add two numbers here
            helper::CopyToBuffer(buf, pos, &FlushPosSizeInfo[flushNum][2 * writer], 2);
        }
        helper::CopyToBuffer(buf, pos, &m_WriterDataPos[writer], 1);
    }

    m_FileMetadataIndexManager.WriteFiles((char *)buf.data(), buf.size());
#ifdef DUMPDATALOCINFO
    std::cout << "Flush count is :" << FlushPosSizeInfo.size() << std::endl;
    std::cout << "Write Index positions = {" << std::endl;

    for (size_t i = 0; i < m_Comm.Size(); ++i)
    {
        std::cout << "Writer " << i << " has data at: " << std::endl;
        uint64_t eachWriterSize = FlushPosSizeInfo.size() * 2 + 1;
        for (size_t j = 0; j < FlushPosSizeInfo.size(); ++j)
        {
            std::cout << "loc:" << buf[3 + eachWriterSize * i + j * 2]
                      << " siz:" << buf[3 + eachWriterSize * i + j * 2 + 1] << std::endl;
        }
        std::cout << "loc:" << buf[3 + eachWriterSize * (i + 1) - 1] << std::endl;
    }
    std::cout << "}" << std::endl;
#endif
    m_FileMetadataIndexManager.FlushFiles();

    /* reset for next timestep */
    FlushPosSizeInfo.clear();
}